

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Matchers::Impl::StdString::Contains::~Contains(Contains *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Contains_001ffd58;
  CasedString::~CasedString((CasedString *)0x18f6da);
  MatcherImpl<Catch::Matchers::Impl::StdString::Contains,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~MatcherImpl((MatcherImpl<Catch::Matchers::Impl::StdString::Contains,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x18f6e4);
  return;
}

Assistant:

Matchers::Impl::StdString::Contains::~Contains() {}